

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer_strategy.cpp
# Opt level: O0

void __thiscall
TracerStrategy::generateActions(TracerStrategy *this,PlayerSight *sight,Actions *actions)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  bool bVar5;
  reference pPVar6;
  Router *this_00;
  Vec2 local_94;
  Vec2 local_8c;
  Vec2 local_84;
  Vec2 local_7c;
  Vec2 local_74;
  Vec2 e0;
  float dist;
  Vec2 direction;
  Vec2 local_54;
  Vec2 goal;
  PUnitInfo uinfo;
  const_iterator __end1;
  const_iterator __begin1;
  vector<PUnitInfo,_std::allocator<PUnitInfo>_> *__range1;
  Actions *actions_local;
  PlayerSight *sight_local;
  TracerStrategy *this_local;
  
  if ((this->field_0xc & 1) == 0) {
    __end1 = std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>::begin(&sight->unitInSight);
    uinfo.velocity =
         (Vec2)std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>::end(&sight->unitInSight);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_PUnitInfo_*,_std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>_>
                                       *)&uinfo.velocity), bVar5) {
      pPVar6 = __gnu_cxx::
               __normal_iterator<const_PUnitInfo_*,_std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>_>
               ::operator*(&__end1);
      uVar2 = pPVar6->id;
      uVar4 = (pPVar6->pos).x;
      uVar3 = *(undefined8 *)&(pPVar6->pos).y;
      uinfo.id = (int)uVar3;
      uinfo.pos.x = (float)((ulong)uVar3 >> 0x20);
      uinfo.pos.y = (pPVar6->velocity).y;
      goal.x = (float)uVar2;
      goal.y = (float)uVar4;
      if (uVar2 == this->target) {
        local_54 = Vec2::operator+((Vec2 *)&goal.y,&uinfo.pos);
        this_00 = Router::getInstance();
        bVar5 = Router::Reachable(this_00,local_54);
        if (!bVar5) {
          local_54.y = (float)uinfo.id;
          local_54.x = goal.y;
        }
        register0x00001200 = Vec2::operator-(&local_54,&sight->pos);
        e0.x = Vec2::length((Vec2 *)&e0.y);
        if (this->distance < e0.x) {
          local_74 = Vec2::operator/((Vec2 *)&e0.y,e0.x);
          if (e0.x - 2.0 <= this->distance) {
            iVar1 = sight->id;
            local_84 = Vec2::operator*(&local_74,e0.x - this->distance);
            local_7c = Vec2::operator+(&sight->pos,&local_84);
            Actions::emplace(actions,SelectDestination,iVar1,local_7c);
            return;
          }
          iVar1 = sight->id;
          local_94 = Vec2::operator*(&local_74,2.0);
          local_8c = Vec2::operator+(&sight->pos,&local_94);
          Actions::emplace(actions,SelectDestination,iVar1,local_8c);
          return;
        }
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_PUnitInfo_*,_std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>_>::
      operator++(&__end1);
    }
    Actions::emplace(actions,SelectDestination,sight->id,sight->pos);
  }
  return;
}

Assistant:

void TracerStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    for (auto uinfo : sight.unitInSight)
        if (uinfo.id == target)
        {
            Vec2 goal = uinfo.pos + uinfo.velocity;
            if (!Router::getInstance()->Reachable(goal))
                goal = uinfo.pos;
            Vec2 direction = goal - sight.pos;
            float dist = direction.length();
            if (dist <= distance)
                break;
            Vec2 e0 = direction / dist;
            if (dist - PlayerVelocity <= distance)
                actions->emplace(SelectDestination, sight.id, sight.pos + e0 * (dist - distance));
            else
                actions->emplace(SelectDestination, sight.id, sight.pos + e0 * PlayerVelocity);
            return;
        }
    actions->emplace(SelectDestination, sight.id, sight.pos);
    return;
}